

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O1

void __thiscall
compress_tests::compress_p2pk_scripts_not_on_curve::test_method
          (compress_p2pk_scripts_not_on_curve *this)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  bool bVar5;
  uchar *pbegin;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  ptrdiff_t _Num;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long lVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 local_241;
  undefined1 local_240 [16];
  undefined1 *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  bool success;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  bool done;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  assertion_result local_1a8;
  undefined1 **local_190;
  _func_int ****local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  _func_int *****local_168;
  _func_int ****local_160;
  char *local_158;
  assertion_result local_150;
  CScript uncompressed_script;
  uint local_118 [2];
  CompressedScript compressed_script;
  CompressedScript out;
  CScript script;
  CPubKey pubkey_not_on_curve;
  XOnlyPubKey x_not_on_curve;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  do {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out,
               &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                super_RandomMixin<FastRandomContext>,0x20);
    uVar4 = out._union.indirect_contents.indirect;
    if (out._union._8_8_ - out._union._0_8_ != 0x20) {
      __assert_fail("vch.size() == WIDTH",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                    ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
    }
    memcpy(&pubkey_not_on_curve,out._union.indirect_contents.indirect,0x20);
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = pubkey_not_on_curve.vch[1];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = pubkey_not_on_curve.vch[2];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = pubkey_not_on_curve.vch[3];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = pubkey_not_on_curve.vch[4];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = pubkey_not_on_curve.vch[5];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = pubkey_not_on_curve.vch[6];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = pubkey_not_on_curve.vch[7];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = pubkey_not_on_curve.vch[0];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = pubkey_not_on_curve.vch[8];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = pubkey_not_on_curve.vch[9];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = pubkey_not_on_curve.vch[10]
    ;
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] =
         pubkey_not_on_curve.vch[0xb];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] =
         pubkey_not_on_curve.vch[0xc];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] =
         pubkey_not_on_curve.vch[0xd];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] =
         pubkey_not_on_curve.vch[0xe];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] =
         pubkey_not_on_curve.vch[0xf];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] =
         pubkey_not_on_curve.vch[0x10];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] =
         pubkey_not_on_curve.vch[0x11];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] =
         pubkey_not_on_curve.vch[0x12];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] =
         pubkey_not_on_curve.vch[0x13];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] =
         pubkey_not_on_curve.vch[0x14];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] =
         pubkey_not_on_curve.vch[0x15];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] =
         pubkey_not_on_curve.vch[0x16];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] =
         pubkey_not_on_curve.vch[0x17];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] =
         pubkey_not_on_curve.vch[0x18];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] =
         pubkey_not_on_curve.vch[0x19];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] =
         pubkey_not_on_curve.vch[0x1a];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] =
         pubkey_not_on_curve.vch[0x1b];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] =
         pubkey_not_on_curve.vch[0x1c];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] =
         pubkey_not_on_curve.vch[0x1d];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] =
         pubkey_not_on_curve.vch[0x1e];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] =
         pubkey_not_on_curve.vch[0x1f];
    if ((char *)uVar4 != (char *)0x0) {
      operator_delete((void *)uVar4,out._union._16_8_ - uVar4);
    }
    bVar5 = XOnlyPubKey::IsFullyValid(&x_not_on_curve);
  } while (bVar5);
  pbegin = (uchar *)operator_new(0x41);
  pbegin[0] = '\0';
  pbegin[1] = '\0';
  pbegin[2] = '\0';
  pbegin[3] = '\0';
  pbegin[4] = '\0';
  pbegin[5] = '\0';
  pbegin[6] = '\0';
  pbegin[7] = '\0';
  pbegin[8] = '\0';
  pbegin[9] = '\0';
  pbegin[10] = '\0';
  pbegin[0xb] = '\0';
  pbegin[0xc] = '\0';
  pbegin[0xd] = '\0';
  pbegin[0xe] = '\0';
  pbegin[0xf] = '\0';
  pbegin[0x30] = '\0';
  pbegin[0x31] = '\0';
  pbegin[0x32] = '\0';
  pbegin[0x33] = '\0';
  pbegin[0x34] = '\0';
  pbegin[0x35] = '\0';
  pbegin[0x36] = '\0';
  pbegin[0x37] = '\0';
  pbegin[0x38] = '\0';
  pbegin[0x39] = '\0';
  pbegin[0x3a] = '\0';
  pbegin[0x3b] = '\0';
  pbegin[0x3c] = '\0';
  pbegin[0x3d] = '\0';
  pbegin[0x3e] = '\0';
  pbegin[0x3f] = '\0';
  pbegin[0x20] = '\0';
  pbegin[0x21] = '\0';
  pbegin[0x22] = '\0';
  pbegin[0x23] = '\0';
  pbegin[0x24] = '\0';
  pbegin[0x25] = '\0';
  pbegin[0x26] = '\0';
  pbegin[0x27] = '\0';
  pbegin[0x28] = '\0';
  pbegin[0x29] = '\0';
  pbegin[0x2a] = '\0';
  pbegin[0x2b] = '\0';
  pbegin[0x2c] = '\0';
  pbegin[0x2d] = '\0';
  pbegin[0x2e] = '\0';
  pbegin[0x2f] = '\0';
  pbegin[0x10] = '\0';
  pbegin[0x11] = '\0';
  pbegin[0x12] = '\0';
  pbegin[0x13] = '\0';
  pbegin[0x14] = '\0';
  pbegin[0x15] = '\0';
  pbegin[0x16] = '\0';
  pbegin[0x17] = '\0';
  pbegin[0x18] = '\0';
  pbegin[0x19] = '\0';
  pbegin[0x1a] = '\0';
  pbegin[0x1b] = '\0';
  pbegin[0x1c] = '\0';
  pbegin[0x1d] = '\0';
  pbegin[0x1e] = '\0';
  pbegin[0x1f] = '\0';
  pbegin[0x40] = '\0';
  *pbegin = '\x04';
  *(undefined8 *)(pbegin + 0x11) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)(pbegin + 0x19) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)(pbegin + 1) = x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_
  ;
  *(undefined8 *)(pbegin + 9) = x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_
  ;
  CPubKey::Set<unsigned_char_const*>(&pubkey_not_on_curve,pbegin,pbegin + 0x41);
  if ((((pubkey_not_on_curve.vch[0] & 0xfe) != 2) && (1 < pubkey_not_on_curve.vch[0] - 6)) &&
     (pubkey_not_on_curve.vch[0] != '\x04')) {
    __assert_fail("pubkey_not_on_curve.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
                  ,0x94,"void compress_tests::compress_p2pk_scripts_not_on_curve::test_method()");
  }
  bVar5 = CPubKey::IsFullyValid(&pubkey_not_on_curve);
  if (bVar5) {
    __assert_fail("!pubkey_not_on_curve.IsFullyValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
                  ,0x95,"void compress_tests::compress_p2pk_scripts_not_on_curve::test_method()");
  }
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&compressed_script,
             &pubkey_not_on_curve);
  this_00 = &CScript::operator<<((CScript *)&out,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &compressed_script)->super_CScriptBase;
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar6 = this_00;
  }
  local_180._vptr_lazy_ostream = (_func_int **)CONCAT71(local_180._vptr_lazy_ostream._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar6->_union + (long)(int)uVar2),(uchar *)&local_180);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,this_00);
  if (compressed_script._union.indirect_contents.indirect != (char *)0x0) {
    operator_delete(compressed_script._union.indirect_contents.indirect,
                    compressed_script._union._16_8_ - compressed_script._union._0_8_);
  }
  if (0x1c < (uint)out._union._28_4_) {
    free(out._union.indirect_contents.indirect);
    out._union.indirect_contents.indirect = (char *)0x0;
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x97;
  file.m_begin = (iterator)&local_1c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d0,msg);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  sVar3 = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    sVar3 = script.super_CScriptBase._size;
  }
  local_168 = (_func_int *****)0xf98c4c;
  local_160 = (_func_int ****)CONCAT44(local_160._4_4_,sVar3);
  local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar3 == 0x43);
  local_150._0_8_ = &local_188;
  local_188 = (_func_int ****)CONCAT44(local_188._4_4_,0x43);
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  uncompressed_script.super_CScriptBase._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  uncompressed_script.super_CScriptBase._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
       + 0x60;
  out._union._24_8_ = local_240;
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  compressed_script._union.direct[8] = '\0';
  compressed_script._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  compressed_script._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_240._0_8_ = &local_160;
  compressed_script._union._24_8_ = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_180,1,2,REQUIRE,0xe9aa89,(size_t)&uncompressed_script,0x97,&out,"67U"
             ,&compressed_script);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9b;
  file_00.m_begin = (iterator)&local_1e8;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f8,
             msg_00);
  local_1a8.m_message.px = (element_type *)((ulong)local_1a8.m_message.px & 0xffffffffffffff00);
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = (undefined1 **)0xf98c4c;
  local_188 = (_func_int ****)((ulong)local_188 & 0xffffffffffffff00);
  local_150._0_8_ = &done;
  uncompressed_script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)(CONCAT71(uncompressed_script.super_CScriptBase._union._1_7_,done) ^ 1);
  uncompressed_script.super_CScriptBase._union._8_8_ = 0;
  uncompressed_script.super_CScriptBase._union._16_8_ = 0;
  local_240._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_240._8_8_ = "";
  compressed_script._union.direct[8] = '\0';
  compressed_script._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d4010;
  compressed_script._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_160 = (_func_int ****)&local_188;
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d4010;
  local_170 = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_168 = &local_160;
  compressed_script._union._24_8_ = &local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&uncompressed_script,(lazy_ostream *)&local_1a8,1,2,REQUIRE,
             0xfeb143,(size_t)local_240,0x9b,&compressed_script,"false",&local_180);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&uncompressed_script.super_CScriptBase._union + 0x10));
  prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector<unsigned_char_*>
            (&compressed_script,(uchar *)&x_not_on_curve,(uchar *)&local_38);
  local_118[0] = 4;
  local_118[1] = 5;
  lVar9 = 0;
  do {
    uncompressed_script.super_CScriptBase._union._16_8_ = 0;
    uncompressed_script.super_CScriptBase._24_8_ = 0;
    uncompressed_script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    uncompressed_script.super_CScriptBase._union._8_8_ = 0;
    success = DecompressScript(&uncompressed_script,*(uint *)((long)local_118 + lVar9),
                               &compressed_script);
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
    ;
    local_208 = "";
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xa3;
    file_01.m_begin = (iterator)&local_210;
    msg_01.m_end = pvVar8;
    msg_01.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
               msg_01);
    local_240._8_8_ = local_240._8_8_ & 0xffffffffffffff00;
    local_240._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = "";
    local_241 = 0;
    local_150._0_8_ = CONCAT71(local_150._1_7_,success) ^ 1;
    local_150.m_message.px = (element_type *)0x0;
    local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_160 = (_func_int ****)0xe9a912;
    local_158 = "";
    local_188 = (_func_int ****)&success;
    local_180.m_empty = false;
    local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d4010;
    local_170 = boost::unit_test::lazy_ostream::inst;
    local_168 = &local_188;
    local_1b0 = &local_241;
    local_1a8.m_message.px = (element_type *)((ulong)local_1a8.m_message.px & 0xffffffffffffff00);
    local_1a8._0_8_ = &PTR__lazy_ostream_013d4010;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_190 = &local_1b0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_150,(lazy_ostream *)local_240,1,2,REQUIRE,0xf6e414,(size_t)&local_160,0xa3,
               &local_180,"false",&local_1a8);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    if (0x1c < uncompressed_script.super_CScriptBase._size) {
      free(uncompressed_script.super_CScriptBase._union.indirect_contents.indirect);
      uncompressed_script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    lVar9 = lVar9 + 4;
  } while (lVar9 != 8);
  if (0x21 < compressed_script._size) {
    free(compressed_script._union.indirect_contents.indirect);
    compressed_script._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x21 < out._size) {
    free(out._union.indirect_contents.indirect);
    out._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < script.super_CScriptBase._size) {
    free(script.super_CScriptBase._union.indirect_contents.indirect);
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  operator_delete(pbegin,0x41);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_p2pk_scripts_not_on_curve)
{
    XOnlyPubKey x_not_on_curve;
    do {
        x_not_on_curve = XOnlyPubKey(m_rng.randbytes(32));
    } while (x_not_on_curve.IsFullyValid());

    // Check that P2PK script with uncompressed pubkey [=> OP_PUSH65 <0x04 .....> OP_CHECKSIG]
    // which is not fully valid (i.e. point is not on curve) can't be compressed
    std::vector<unsigned char> pubkey_raw(65, 0);
    pubkey_raw[0] = 4;
    std::copy(x_not_on_curve.begin(), x_not_on_curve.end(), &pubkey_raw[1]);
    CPubKey pubkey_not_on_curve(pubkey_raw);
    assert(pubkey_not_on_curve.IsValid());
    assert(!pubkey_not_on_curve.IsFullyValid());
    CScript script = CScript() << ToByteVector(pubkey_not_on_curve) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(script.size(), 67U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, false);

    // Check that compressed P2PK script with uncompressed pubkey that is not fully
    // valid (i.e. x coordinate of the pubkey is not on curve) can't be decompressed
    CompressedScript compressed_script(x_not_on_curve.begin(), x_not_on_curve.end());
    for (unsigned int compression_id : {4, 5}) {
        CScript uncompressed_script;
        bool success = DecompressScript(uncompressed_script, compression_id, compressed_script);
        BOOST_CHECK_EQUAL(success, false);
    }
}